

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JnHelperMethod.cpp
# Opt level: O0

char16 * GetVtableName(VTableValue value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16_t *pcStack_10;
  VTableValue value_local;
  
  switch(value) {
  case VtableDynamicObject:
    pcStack_10 = L"vtable DynamicObject";
    break;
  case VtableInvalid:
    pcStack_10 = L"vtable Invalid";
    break;
  case VtablePropertyString:
    pcStack_10 = L"vtable PropertyString";
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JnHelperMethod.cpp"
                       ,0x1c6,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    pcStack_10 = L"vtable unknown";
    break;
  case VtableJavascriptBoolean:
    pcStack_10 = L"vtable JavascriptBoolean";
    break;
  case VtableJavascriptArray:
    pcStack_10 = L"vtable JavascriptArray";
    break;
  case VtableInt8Array:
    pcStack_10 = L"vtable Int8Array";
    break;
  case VtableUint8Array:
    pcStack_10 = L"vtable Uint8Array";
    break;
  case VtableUint8ClampedArray:
    pcStack_10 = L"vtable Uint8ClampedArray";
    break;
  case VtableInt16Array:
    pcStack_10 = L"vtable Int16Array";
    break;
  case VtableUint16Array:
    pcStack_10 = L"vtable Uint16Array";
    break;
  case VtableInt32Array:
    pcStack_10 = L"vtable Int32Array";
    break;
  case VtableUint32Array:
    pcStack_10 = L"vtable Uint32Array";
    break;
  case VtableFloat32Array:
    pcStack_10 = L"vtable Float32Array";
    break;
  case VtableFloat64Array:
    pcStack_10 = L"vtable Float64Array";
    break;
  case VtableJavascriptPixelArray:
    pcStack_10 = L"vtable JavascriptPixelArray";
    break;
  case VtableInt64Array:
    pcStack_10 = L"vtable Int64Array";
    break;
  case VtableUint64Array:
    pcStack_10 = L"vtable Uint64Array";
    break;
  case VtableBoolArray:
    pcStack_10 = L"vtable BoolArray";
    break;
  case VtableCharArray:
    pcStack_10 = L"vtable CharArray";
    break;
  case VtableInt8VirtualArray:
    pcStack_10 = L"vtable Int8VirtualArray";
    break;
  case VtableUint8VirtualArray:
    pcStack_10 = L"vtable Uint8VirtualArray";
    break;
  case VtableUint8ClampedVirtualArray:
    pcStack_10 = L"vtable Uint8ClampedVirtualArray";
    break;
  case VtableInt16VirtualArray:
    pcStack_10 = L"vtable Int16VirtualArray";
    break;
  case VtableUint16VirtualArray:
    pcStack_10 = L"vtable Uint16VirtualArray";
    break;
  case VtableInt32VirtualArray:
    pcStack_10 = L"vtable Int32VirtualArray";
    break;
  case VtableUint32VirtualArray:
    pcStack_10 = L"vtable Uint32VirtualArray";
    break;
  case VtableFloat32VirtualArray:
    pcStack_10 = L"vtable Float32VirtualArray";
    break;
  case VtableFloat64VirtualArray:
    pcStack_10 = L"vtable Float64VirtualArray";
    break;
  case VtableNativeIntArray:
    pcStack_10 = L"vtable NativeIntArray";
    break;
  case VtableNativeFloatArray:
    pcStack_10 = L"vtable NativeFloatArray";
    break;
  case VtableJavascriptNativeIntArray:
    pcStack_10 = L"vtable JavascriptNativeIntArray";
    break;
  case VtableJavascriptRegExp:
    pcStack_10 = L"vtable JavascriptRegExp";
    break;
  case VtableStackScriptFunction:
    pcStack_10 = L"vtable StackScriptFunction";
    break;
  case VtableScriptFunctionWithInlineCacheAndHomeObj:
    pcStack_10 = L"vtable ScriptFunctionWithInlineCacheAndHomeObj";
    break;
  case VtableScriptFunctionWithInlineCacheHomeObjAndComputedName:
    pcStack_10 = L"vtable ScriptFunctionWithInlineCacheHomeObjAndComputedName";
    break;
  case VtableConcatStringMulti:
    pcStack_10 = L"vtable ConcatStringMulti";
    break;
  case VtableCompoundString:
    pcStack_10 = L"vtable CompoundString";
  }
  return pcStack_10;
}

Assistant:

const char16 *GetVtableName(VTableValue value)
{
    switch (value)
    {
#if !defined(_M_X64)
    case VtableJavascriptNumber:
        return _u("vtable JavascriptNumber");
        break;
#endif
    case VtableDynamicObject:
        return _u("vtable DynamicObject");
        break;
    case VtableInvalid:
        return _u("vtable Invalid");
        break;
    case VtablePropertyString:
        return _u("vtable PropertyString");
        break;
    case VtableJavascriptBoolean:
        return _u("vtable JavascriptBoolean");
        break;
    case VtableJavascriptArray:
        return _u("vtable JavascriptArray");
        break;
    case VtableInt8Array:
        return _u("vtable Int8Array");
        break;
    case VtableUint8Array:
        return _u("vtable Uint8Array");
        break;
    case VtableUint8ClampedArray:
        return _u("vtable Uint8ClampedArray");
        break;
    case VtableInt16Array:
        return _u("vtable Int16Array");
        break;
    case VtableUint16Array:
        return _u("vtable Uint16Array");
        break;
    case VtableInt32Array:
        return _u("vtable Int32Array");
        break;
    case VtableUint32Array:
        return _u("vtable Uint32Array");
        break;
    case VtableFloat32Array:
        return _u("vtable Float32Array");
        break;
    case VtableFloat64Array:
        return _u("vtable Float64Array");
        break;
    case VtableJavascriptPixelArray:
        return _u("vtable JavascriptPixelArray");
        break;
    case VtableInt64Array:
        return _u("vtable Int64Array");
        break;
    case VtableUint64Array:
        return _u("vtable Uint64Array");
        break;
    case VtableInt8VirtualArray:
        return _u("vtable Int8VirtualArray");
        break;
    case VtableUint8VirtualArray:
        return _u("vtable Uint8VirtualArray");
        break;
    case VtableUint8ClampedVirtualArray:
        return _u("vtable Uint8ClampedVirtualArray");
        break;
    case VtableInt16VirtualArray:
        return _u("vtable Int16VirtualArray");
        break;
    case VtableUint16VirtualArray:
        return _u("vtable Uint16VirtualArray");
        break;
    case VtableInt32VirtualArray:
        return _u("vtable Int32VirtualArray");
        break;
    case VtableUint32VirtualArray:
        return _u("vtable Uint32VirtualArray");
        break;
    case VtableFloat32VirtualArray:
        return _u("vtable Float32VirtualArray");
        break;
    case VtableFloat64VirtualArray:
        return _u("vtable Float64VirtualArray");
        break;
    case VtableBoolArray:
        return _u("vtable BoolArray");
        break;
    case VtableCharArray:
        return _u("vtable CharArray");
        break;
    case VtableNativeIntArray:
        return _u("vtable NativeIntArray");
        break;
    case VtableNativeFloatArray:
        return _u("vtable NativeFloatArray");
        break;
    case VtableJavascriptNativeIntArray:
        return _u("vtable JavascriptNativeIntArray");
        break;
    case VtableJavascriptRegExp:
        return _u("vtable JavascriptRegExp");
        break;
    case VtableStackScriptFunction:
        return _u("vtable StackScriptFunction");
        break;
    case VtableScriptFunctionWithInlineCacheAndHomeObj:
        return _u("vtable ScriptFunctionWithInlineCacheAndHomeObj");
        break;
    case VtableScriptFunctionWithInlineCacheHomeObjAndComputedName:
        return _u("vtable ScriptFunctionWithInlineCacheHomeObjAndComputedName");
        break;
    case VtableConcatStringMulti:
        return _u("vtable ConcatStringMulti");
        break;
    case VtableCompoundString:
        return _u("vtable CompoundString");
        break;
    default:
        Assert(false);
        break;
    }

    return _u("vtable unknown");
}